

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_dt_double(void)

{
  XSValue_Data actValue;
  XSValue_Data actValue_00;
  XSValue_Data actValue_01;
  XSValue_Data actValue_02;
  XSValue_Data actValue_03;
  XSValue_Data actValue_04;
  XSValue_Data actValue_05;
  XSValue_Data actValue_06;
  XSValue_Data actValue_07;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  XSValue_Data expValue_02;
  XSValue_Data expValue_03;
  XSValue_Data expValue_04;
  XSValue_Data expValue_05;
  XSValue_Data expValue_06;
  XSValue_Data expValue_07;
  byte bVar1;
  bool bVar2;
  XMLCh *pXVar3;
  char *pcVar4;
  XSValue *pXVar5;
  char *pcVar6;
  char *pcVar7;
  wchar16 *pwVar8;
  long lVar9;
  undefined1 *__src;
  void *pvVar10;
  bool bVar11;
  StrX local_d48;
  StrX local_d38;
  char *local_d28;
  char *actRetCanRep_inchar_8;
  wchar16 *local_d10;
  XMLCh *actRetCanRep_10;
  undefined1 local_d00 [4];
  Status myStatus_32;
  StrX local_cf0;
  char *local_ce0;
  char *actRetCanRep_inchar_7;
  wchar16 *local_cc8;
  XMLCh *actRetCanRep_9;
  undefined1 local_cb8 [4];
  Status myStatus_31;
  StrX local_ca8;
  char *local_c98;
  char *actRetCanRep_inchar_6;
  wchar16 *local_c80;
  XMLCh *actRetCanRep_8;
  undefined1 local_c70 [4];
  Status myStatus_30;
  StrX local_c60;
  char *local_c50;
  char *actRetCanRep_inchar_5;
  wchar16 *local_c38;
  XMLCh *actRetCanRep_7;
  undefined1 local_c28 [4];
  Status myStatus_29;
  StrX local_c18;
  StrX local_c08;
  long local_bf8;
  XMLCh *actRetCanRep_6;
  undefined1 local_be8 [4];
  Status myStatus_28;
  StrX local_bd8;
  StrX local_bc8;
  long local_bb8;
  XMLCh *actRetCanRep_5;
  undefined1 local_ba8 [4];
  Status myStatus_27;
  StrX local_b98;
  char *local_b88;
  char *actRetCanRep_inchar_4;
  wchar16 *local_b70;
  XMLCh *actRetCanRep_4;
  undefined1 local_b60 [4];
  Status myStatus_26;
  StrX local_b50;
  char *local_b40;
  char *actRetCanRep_inchar_3;
  wchar16 *local_b28;
  XMLCh *actRetCanRep_3;
  undefined1 local_b18 [4];
  Status myStatus_25;
  StrX local_b08;
  char *local_af8;
  char *actRetCanRep_inchar_2;
  wchar16 *local_ae0;
  XMLCh *actRetCanRep_2;
  undefined1 local_ad0 [4];
  Status myStatus_24;
  StrX local_ac0;
  char *local_ab0;
  char *actRetCanRep_inchar_1;
  wchar16 *local_a98;
  XMLCh *actRetCanRep_1;
  undefined1 local_a88 [4];
  Status myStatus_23;
  StrX local_a78;
  char *local_a68;
  char *actRetCanRep_inchar;
  wchar16 *local_a50;
  XMLCh *actRetCanRep;
  Status myStatus_22;
  int j;
  StrX local_a30;
  StrX local_a20;
  XSValue *local_a10;
  XSValue *actRetValue_10;
  undefined1 local_a00 [4];
  Status myStatus_21;
  StrX local_9f0;
  StrX local_9e0;
  XSValue *local_9d0;
  XSValue *actRetValue_9;
  undefined1 local_9c0 [4];
  Status myStatus_20;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 local_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  StrX local_960;
  XSValue *local_950;
  XSValue *actRetValue_8;
  undefined1 local_940 [4];
  Status myStatus_19;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 local_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  StrX local_8e0;
  XSValue *local_8d0;
  XSValue *actRetValue_7;
  undefined1 local_8c0 [4];
  Status myStatus_18;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  StrX local_860;
  XSValue *local_850;
  XSValue *actRetValue_6;
  undefined1 local_840 [4];
  Status myStatus_17;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  StrX local_7e0;
  XSValue *local_7d0;
  XSValue *actRetValue_5;
  undefined1 local_7c0 [4];
  Status myStatus_16;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  StrX local_760;
  XSValue *local_750;
  XSValue *actRetValue_4;
  undefined1 local_740 [4];
  Status myStatus_15;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  StrX local_6e0;
  XSValue *local_6d0;
  XSValue *actRetValue_3;
  undefined1 local_6c0 [4];
  Status myStatus_14;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  StrX local_660;
  XSValue *local_650;
  XSValue *actRetValue_2;
  undefined1 local_640 [4];
  Status myStatus_13;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  StrX local_5e0;
  XSValue *local_5d0;
  XSValue *actRetValue_1;
  undefined1 local_5c0 [4];
  Status myStatus_12;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  StrX local_560;
  XSValue *local_550;
  XSValue *actRetValue;
  Status myStatus_11;
  int i;
  StrX local_530;
  StrX local_520;
  byte local_50d;
  Status local_50c;
  undefined1 local_508 [3];
  bool actRetValid_10;
  Status myStatus_10;
  StrX local_4f8;
  StrX local_4e8;
  byte local_4d5;
  Status local_4d4;
  undefined1 local_4d0 [3];
  bool actRetValid_9;
  Status myStatus_9;
  StrX local_4c0;
  byte local_4ad;
  Status local_4ac;
  undefined1 local_4a8 [3];
  bool actRetValid_8;
  Status myStatus_8;
  StrX local_498;
  byte local_485;
  Status local_484;
  undefined1 local_480 [3];
  bool actRetValid_7;
  Status myStatus_7;
  StrX local_470;
  byte local_45d;
  Status local_45c;
  undefined1 local_458 [3];
  bool actRetValid_6;
  Status myStatus_6;
  StrX local_448;
  byte local_435;
  Status local_434;
  undefined1 local_430 [3];
  bool actRetValid_5;
  Status myStatus_5;
  StrX local_420;
  byte local_40d;
  Status local_40c;
  undefined1 local_408 [3];
  bool actRetValid_4;
  Status myStatus_4;
  StrX local_3f8;
  byte local_3e5;
  Status local_3e4;
  undefined1 local_3e0 [3];
  bool actRetValid_3;
  Status myStatus_3;
  StrX local_3d0;
  byte local_3bd;
  Status local_3bc;
  undefined1 local_3b8 [3];
  bool actRetValid_2;
  Status myStatus_2;
  StrX local_3a8;
  byte local_395;
  Status local_394;
  undefined1 local_390 [3];
  bool actRetValid_1;
  Status myStatus_1;
  StrX local_370;
  byte local_35d;
  Status local_35c;
  char acStack_358 [3];
  bool actRetValid;
  Status myStatus;
  char data_canrep_5 [9];
  char data_rawstr_5 [11];
  char data_canrep_4 [6];
  char data_rawstr_4 [11];
  char data_canrep_3 [10];
  char data_rawstr_3 [14];
  char data_canrep_2 [9];
  char data_rawstr_2 [8];
  char data_canrep_1 [10];
  char cStack_2d6;
  char cStack_2d5;
  char cStack_2d4;
  char cStack_2d3;
  char cStack_2d2;
  char cStack_2d1;
  char data_rawstr_1 [17];
  char lex_iv_2 [8];
  char lex_iv_1 [9];
  XSValue_Data lex_iv_ran_v_4;
  XSValue_Data lex_iv_ran_v_3;
  XSValue_Data lex_iv_ran_v_2;
  XSValue_Data lex_iv_ran_v_1;
  char lex_v_ran_iv_4_canrep [2];
  char lex_v_ran_iv_3_canrep [2];
  char lex_v_ran_iv_2_canrep [5];
  char lex_v_ran_iv_1_canrep [4];
  char lex_v_ran_iv_4 [25];
  char lex_v_ran_iv_3 [25];
  char lex_v_ran_iv_2 [25];
  char lex_v_ran_iv_1 [25];
  undefined1 local_170 [8];
  XSValue_Data act_v_ran_v_4;
  XSValue_Data act_v_ran_v_3;
  XSValue_Data act_v_ran_v_2;
  XSValue_Data act_v_ran_v_1;
  XSValue_Data act_v_ran_v_0;
  char lex_v_ran_v_4 [25];
  char lex_v_ran_v_3 [25];
  char lex_v_ran_v_2 [25];
  char lex_v_ran_v_1 [25];
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char lex_v_ran_v_0 [17];
  bool toValidate;
  DataType dt;
  
  lex_v_ran_v_1[0x18] = ' ';
  cStack_27 = ' ';
  cStack_26 = ' ';
  cStack_25 = '1';
  cStack_24 = '2';
  cStack_23 = '3';
  cStack_22 = '4';
  cStack_21 = '.';
  builtin_strncpy(lex_v_ran_v_1 + 8,"158e+308",9);
  stack0xffffffffffffffb8 = 0x39363739372e312b;
  builtin_strncpy(lex_v_ran_v_1,"31348623",8);
  lex_v_ran_v_2[8] = '1';
  lex_v_ran_v_2[9] = '5';
  lex_v_ran_v_2[10] = '8';
  lex_v_ran_v_2[0xb] = 'e';
  lex_v_ran_v_2[0xc] = '+';
  lex_v_ran_v_2[0xd] = '3';
  lex_v_ran_v_2[0xe] = '0';
  lex_v_ran_v_2[0xf] = '8';
  lex_v_ran_v_2[0x10] = '\0';
  stack0xffffffffffffff98 = 0x39363739372e312d;
  lex_v_ran_v_2[0] = '3';
  lex_v_ran_v_2[1] = '1';
  lex_v_ran_v_2[2] = '3';
  lex_v_ran_v_2[3] = '4';
  lex_v_ran_v_2[4] = '8';
  lex_v_ran_v_2[5] = '6';
  lex_v_ran_v_2[6] = '2';
  lex_v_ran_v_2[7] = '3';
  lex_v_ran_v_3[8] = '0';
  lex_v_ran_v_3[9] = '1';
  lex_v_ran_v_3[10] = '4';
  lex_v_ran_v_3[0xb] = 'e';
  lex_v_ran_v_3[0xc] = '-';
  lex_v_ran_v_3[0xd] = '3';
  lex_v_ran_v_3[0xe] = '0';
  lex_v_ran_v_3[0xf] = '8';
  lex_v_ran_v_3[0x10] = '\0';
  stack0xffffffffffffff78 = 0x37303532322e322b;
  lex_v_ran_v_3[0] = '3';
  lex_v_ran_v_3[1] = '8';
  lex_v_ran_v_3[2] = '5';
  lex_v_ran_v_3[3] = '8';
  lex_v_ran_v_3[4] = '5';
  lex_v_ran_v_3[5] = '0';
  lex_v_ran_v_3[6] = '7';
  lex_v_ran_v_3[7] = '2';
  lex_v_ran_v_4[8] = '0';
  lex_v_ran_v_4[9] = '1';
  lex_v_ran_v_4[10] = '4';
  lex_v_ran_v_4[0xb] = 'e';
  lex_v_ran_v_4[0xc] = '-';
  lex_v_ran_v_4[0xd] = '3';
  lex_v_ran_v_4[0xe] = '0';
  lex_v_ran_v_4[0xf] = '8';
  lex_v_ran_v_4[0x10] = '\0';
  act_v_ran_v_0.fValue.f_datetime.f_milisec = 7.267827615692917e-43;
  lex_v_ran_v_4[0] = '3';
  lex_v_ran_v_4[1] = '8';
  lex_v_ran_v_4[2] = '5';
  lex_v_ran_v_4[3] = '8';
  lex_v_ran_v_4[4] = '5';
  lex_v_ran_v_4[5] = '0';
  lex_v_ran_v_4[6] = '7';
  lex_v_ran_v_4[7] = '2';
  act_v_ran_v_0.f_datatype = 0xa2100000;
  act_v_ran_v_0._4_4_ = 0x42a67242;
  act_v_ran_v_1.f_datatype = ~dt_string;
  act_v_ran_v_1._4_4_ = 0x7fefffff;
  act_v_ran_v_2.f_datatype = ~dt_string;
  act_v_ran_v_2._4_4_ = 0xffefffff;
  act_v_ran_v_3.f_datatype = dt_string;
  act_v_ran_v_3._4_4_ = 0x100000;
  act_v_ran_v_4.f_datatype = dt_string;
  act_v_ran_v_4._4_4_ = 0x80100000;
  stack0xfffffffffffffe68 = 0x39363739372e312b;
  lex_v_ran_iv_2[8] = '1';
  lex_v_ran_iv_2[9] = '5';
  lex_v_ran_iv_2[10] = '8';
  lex_v_ran_iv_2[0xb] = 'e';
  lex_v_ran_iv_2[0xc] = '+';
  lex_v_ran_iv_2[0xd] = '3';
  lex_v_ran_iv_2[0xe] = '0';
  lex_v_ran_iv_2[0xf] = '9';
  lex_v_ran_iv_2[0x10] = '\0';
  stack0xfffffffffffffe48 = 0x39363739372e312d;
  lex_v_ran_iv_2[0] = '3';
  lex_v_ran_iv_2[1] = '1';
  lex_v_ran_iv_2[2] = '3';
  lex_v_ran_iv_2[3] = '4';
  lex_v_ran_iv_2[4] = '8';
  lex_v_ran_iv_2[5] = '6';
  lex_v_ran_iv_2[6] = '2';
  lex_v_ran_iv_2[7] = '3';
  lex_v_ran_iv_3[8] = '0';
  lex_v_ran_iv_3[9] = '1';
  lex_v_ran_iv_3[10] = '4';
  lex_v_ran_iv_3[0xb] = 'e';
  lex_v_ran_iv_3[0xc] = '-';
  lex_v_ran_iv_3[0xd] = '3';
  lex_v_ran_iv_3[0xe] = '2';
  lex_v_ran_iv_3[0xf] = '9';
  lex_v_ran_iv_3[0x10] = '\0';
  stack0xfffffffffffffe28 = 0x37303532322e322b;
  lex_v_ran_iv_3[0] = '3';
  lex_v_ran_iv_3[1] = '8';
  lex_v_ran_iv_3[2] = '5';
  lex_v_ran_iv_3[3] = '8';
  lex_v_ran_iv_3[4] = '5';
  lex_v_ran_iv_3[5] = '0';
  lex_v_ran_iv_3[6] = '7';
  lex_v_ran_iv_3[7] = '2';
  lex_v_ran_iv_4[8] = '0';
  lex_v_ran_iv_4[9] = '1';
  lex_v_ran_iv_4[10] = '4';
  lex_v_ran_iv_4[0xb] = 'e';
  lex_v_ran_iv_4[0xc] = '-';
  lex_v_ran_iv_4[0xd] = '3';
  lex_v_ran_iv_4[0xe] = '2';
  lex_v_ran_iv_4[0xf] = '9';
  lex_v_ran_iv_4[0x10] = '\0';
  stack0xfffffffffffffe08 = 0x37303532322e322d;
  lex_v_ran_iv_4[0] = '3';
  lex_v_ran_iv_4[1] = '8';
  lex_v_ran_iv_4[2] = '5';
  lex_v_ran_iv_4[3] = '8';
  lex_v_ran_iv_4[4] = '5';
  lex_v_ran_iv_4[5] = '0';
  lex_v_ran_iv_4[6] = '7';
  lex_v_ran_iv_4[7] = '2';
  lex_v_ran_iv_2_canrep[0] = 'I';
  lex_v_ran_iv_2_canrep[1] = 'N';
  lex_v_ran_iv_2_canrep[2] = 'F';
  lex_v_ran_iv_2_canrep[3] = '\0';
  lex_iv_ran_v_1.fValue._28_4_ = 0x464e492d;
  lex_iv_ran_v_1.fValue._26_2_ = 0x30;
  lex_iv_ran_v_1.fValue._24_2_ = 0x30;
  lex_iv_ran_v_1.f_datatype = dt_string;
  lex_iv_ran_v_1._4_4_ = 0;
  lex_iv_ran_v_1.fValue.f_int = 1;
  lex_iv_ran_v_2.f_datatype = dt_string;
  lex_iv_ran_v_2._4_4_ = 0;
  lex_iv_ran_v_2.fValue.f_int = 0;
  lex_iv_ran_v_3.f_datatype = dt_string;
  lex_iv_ran_v_3._4_4_ = 0;
  lex_iv_ran_v_3.fValue.f_int = 3;
  lex_iv_ran_v_4.f_datatype = dt_string;
  lex_iv_ran_v_4._4_4_ = 0;
  lex_iv_ran_v_4.fValue.f_int = 3;
  builtin_strncpy(lex_iv_2,"12x.e+10",8);
  lex_iv_1[0] = '\0';
  stack0xfffffffffffffd40 = 0x78312b652e3231;
  data_canrep_1[8] = ' ';
  data_canrep_1[9] = ' ';
  cStack_2d6 = ' ';
  cStack_2d5 = ' ';
  cStack_2d4 = '-';
  cStack_2d3 = '1';
  cStack_2d2 = '2';
  cStack_2d1 = '3';
  data_rawstr_1[0] = '.';
  data_rawstr_1[1] = '4';
  data_rawstr_1[2] = '5';
  data_rawstr_1[3] = ' ';
  data_rawstr_1[4] = ' ';
  data_rawstr_1[5] = ' ';
  data_rawstr_1[6] = ' ';
  data_rawstr_1[7] = '\n';
  data_rawstr_1[8] = '\0';
  builtin_strncpy(data_rawstr_2,"-1.2345E",8);
  data_canrep_1[0] = '2';
  data_canrep_1[1] = '\0';
  stack0xfffffffffffffd10 = 0x35342e3332312b;
  stack0xfffffffffffffd00 = 0x3245353433322e31;
  data_canrep_2[0] = '\0';
  data_rawstr_3[0] = '+';
  data_rawstr_3[1] = '0';
  data_rawstr_3[2] = '0';
  data_rawstr_3[3] = '1';
  data_rawstr_3[4] = '2';
  data_rawstr_3[5] = '\0';
  stack0xfffffffffffffcf0 = 0x342e3332312b;
  stack0xfffffffffffffce0 = 0x3145353433322e31;
  data_canrep_3[0] = '4';
  data_canrep_3[1] = '\0';
  _data_canrep_4 = 0x30302e3030312b;
  stack0xfffffffffffffcc8 = 0x45302e31;
  stack0xfffffffffffffcb8 = 0x322e3030313030;
  _acStack_358 = 0x3445333230302e31;
  data_canrep_5[0] = '\0';
  local_35c = st_Init;
  StrX::StrX(&local_370,lex_v_ran_v_1 + 0x18);
  pXVar3 = StrX::unicodeForm(&local_370);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_double,&local_35c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_370);
  local_35d = bVar1 & 1;
  if (local_35d != 1) {
    pXVar3 = getDataTypeString(dt_double);
    StrX::StrX((StrX *)local_390,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_390);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4ae,lex_v_ran_v_1 + 0x18,pcVar4,1);
    StrX::~StrX((StrX *)local_390);
    errSeen = true;
  }
  local_394 = st_Init;
  StrX::StrX(&local_3a8,lex_v_ran_v_2 + 0x18);
  pXVar3 = StrX::unicodeForm(&local_3a8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_double,&local_394,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_3a8);
  local_395 = bVar1 & 1;
  if (local_395 != 1) {
    pXVar3 = getDataTypeString(dt_double);
    StrX::StrX((StrX *)local_3b8,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_3b8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4af,lex_v_ran_v_2 + 0x18,pcVar4,1);
    StrX::~StrX((StrX *)local_3b8);
    errSeen = true;
  }
  local_3bc = st_Init;
  StrX::StrX(&local_3d0,lex_v_ran_v_3 + 0x18);
  pXVar3 = StrX::unicodeForm(&local_3d0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_double,&local_3bc,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_3d0);
  local_3bd = bVar1 & 1;
  if (local_3bd != 1) {
    pXVar3 = getDataTypeString(dt_double);
    StrX::StrX((StrX *)local_3e0,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_3e0);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4b0,lex_v_ran_v_3 + 0x18,pcVar4,1);
    StrX::~StrX((StrX *)local_3e0);
    errSeen = true;
  }
  local_3e4 = st_Init;
  StrX::StrX(&local_3f8,lex_v_ran_v_4 + 0x18);
  pXVar3 = StrX::unicodeForm(&local_3f8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_double,&local_3e4,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_3f8);
  local_3e5 = bVar1 & 1;
  if (local_3e5 != 1) {
    pXVar3 = getDataTypeString(dt_double);
    StrX::StrX((StrX *)local_408,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_408);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4b1,lex_v_ran_v_4 + 0x18,pcVar4,1);
    StrX::~StrX((StrX *)local_408);
    errSeen = true;
  }
  local_40c = st_Init;
  StrX::StrX(&local_420,(char *)((long)&act_v_ran_v_0.fValue + 0x18));
  pXVar3 = StrX::unicodeForm(&local_420);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_double,&local_40c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_420);
  local_40d = bVar1 & 1;
  if (local_40d != 1) {
    pXVar3 = getDataTypeString(dt_double);
    StrX::StrX((StrX *)local_430,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_430);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4b2,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4,1);
    StrX::~StrX((StrX *)local_430);
    errSeen = true;
  }
  local_434 = st_Init;
  StrX::StrX(&local_448,lex_v_ran_iv_2 + 0x18);
  pXVar3 = StrX::unicodeForm(&local_448);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_double,&local_434,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_448);
  local_435 = bVar1 & 1;
  if (local_435 != 1) {
    pXVar3 = getDataTypeString(dt_double);
    StrX::StrX((StrX *)local_458,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_458);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4b5,lex_v_ran_iv_2 + 0x18,pcVar4,1);
    StrX::~StrX((StrX *)local_458);
    errSeen = true;
  }
  local_45c = st_Init;
  StrX::StrX(&local_470,lex_v_ran_iv_3 + 0x18);
  pXVar3 = StrX::unicodeForm(&local_470);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_double,&local_45c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_470);
  local_45d = bVar1 & 1;
  if (local_45d != 1) {
    pXVar3 = getDataTypeString(dt_double);
    StrX::StrX((StrX *)local_480,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_480);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4b6,lex_v_ran_iv_3 + 0x18,pcVar4,1);
    StrX::~StrX((StrX *)local_480);
    errSeen = true;
  }
  local_484 = st_Init;
  StrX::StrX(&local_498,lex_v_ran_iv_4 + 0x18);
  pXVar3 = StrX::unicodeForm(&local_498);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_double,&local_484,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_498);
  local_485 = bVar1 & 1;
  if (local_485 != 1) {
    pXVar3 = getDataTypeString(dt_double);
    StrX::StrX((StrX *)local_4a8,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_4a8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4b7,lex_v_ran_iv_4 + 0x18,pcVar4,1);
    StrX::~StrX((StrX *)local_4a8);
    errSeen = true;
  }
  local_4ac = st_Init;
  StrX::StrX(&local_4c0,lex_v_ran_iv_2_canrep + 4);
  pXVar3 = StrX::unicodeForm(&local_4c0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_double,&local_4ac,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_4c0);
  local_4ad = bVar1 & 1;
  if (local_4ad != 1) {
    pXVar3 = getDataTypeString(dt_double);
    StrX::StrX((StrX *)local_4d0,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_4d0);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4b8,lex_v_ran_iv_2_canrep + 4,pcVar4,1);
    StrX::~StrX((StrX *)local_4d0);
    errSeen = true;
  }
  local_4d4 = st_Init;
  StrX::StrX(&local_4e8,lex_iv_2);
  pXVar3 = StrX::unicodeForm(&local_4e8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_double,&local_4d4,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_4e8);
  local_4d5 = bVar1 & 1;
  if (local_4d5 == 0) {
    if (local_4d4 != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX((StrX *)local_508,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_508);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_4d4);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x4bb,lex_iv_2,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_508);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_double);
    StrX::StrX(&local_4f8,pXVar3);
    pcVar4 = StrX::localForm(&local_4f8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4bb,lex_iv_2,pcVar4,0);
    StrX::~StrX(&local_4f8);
    errSeen = true;
  }
  local_50c = st_Init;
  StrX::StrX(&local_520,data_rawstr_1 + 0x10);
  pXVar3 = StrX::unicodeForm(&local_520);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_double,&local_50c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_520);
  local_50d = bVar1 & 1;
  if (local_50d == 0) {
    if (local_50c != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX((StrX *)&myStatus_11,pXVar3);
      pcVar4 = StrX::localForm((StrX *)&myStatus_11);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_50c);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x4bc,data_rawstr_1 + 0x10,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)&myStatus_11);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_double);
    StrX::StrX(&local_530,pXVar3);
    pcVar4 = StrX::localForm(&local_530);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x4bc,data_rawstr_1 + 0x10,pcVar4,0);
    StrX::~StrX(&local_530);
    errSeen = true;
  }
  for (actRetValue._4_4_ = 0; actRetValue._4_4_ < 2; actRetValue._4_4_ = actRetValue._4_4_ + 1) {
    bVar11 = actRetValue._4_4_ == 0;
    actRetValue._0_4_ = 0;
    StrX::StrX(&local_560,lex_v_ran_v_1 + 0x18);
    pXVar3 = StrX::unicodeForm(&local_560);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_double,(Status *)&actRetValue,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_560);
    local_550 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX((StrX *)local_5c0,pXVar3);
      StrX::localForm((StrX *)local_5c0);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4da,lex_v_ran_v_1 + 0x18);
      StrX::~StrX((StrX *)local_5c0);
      errSeen = true;
    }
    else {
      memcpy(&local_588,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_1.fValue + 0x18);
      memcpy(&local_5b0,pvVar10,0x28);
      actValue.fValue.f_long = uStack_580;
      actValue._0_8_ = local_588;
      actValue.fValue._8_8_ = local_578;
      actValue.fValue._16_8_ = uStack_570;
      actValue.fValue.f_datetime.f_milisec = (double)local_568;
      expValue.fValue.f_long = uStack_5a8;
      expValue._0_8_ = local_5b0;
      expValue.fValue._8_8_ = local_5a0;
      expValue.fValue._16_8_ = uStack_598;
      expValue.fValue.f_datetime.f_milisec = (double)local_590;
      bVar2 = compareActualValue(dt_double,actValue,expValue);
      pXVar5 = local_550;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_550 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_550);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_1._4_4_ = 0;
    StrX::StrX(&local_5e0,lex_v_ran_v_2 + 0x18);
    pXVar3 = StrX::unicodeForm(&local_5e0);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_double,(Status *)((long)&actRetValue_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_5e0);
    local_5d0 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX((StrX *)local_640,pXVar3);
      StrX::localForm((StrX *)local_640);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4db,lex_v_ran_v_2 + 0x18);
      StrX::~StrX((StrX *)local_640);
      errSeen = true;
    }
    else {
      memcpy(&local_608,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_2.fValue + 0x18);
      memcpy(&local_630,pvVar10,0x28);
      actValue_00.fValue.f_long = uStack_600;
      actValue_00._0_8_ = local_608;
      actValue_00.fValue._8_8_ = local_5f8;
      actValue_00.fValue._16_8_ = uStack_5f0;
      actValue_00.fValue.f_datetime.f_milisec = (double)local_5e8;
      expValue_00.fValue.f_long = uStack_628;
      expValue_00._0_8_ = local_630;
      expValue_00.fValue._8_8_ = local_620;
      expValue_00.fValue._16_8_ = uStack_618;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_610;
      bVar2 = compareActualValue(dt_double,actValue_00,expValue_00);
      pXVar5 = local_5d0;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_5d0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_5d0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_2._4_4_ = 0;
    StrX::StrX(&local_660,lex_v_ran_v_3 + 0x18);
    pXVar3 = StrX::unicodeForm(&local_660);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_double,(Status *)((long)&actRetValue_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_660);
    local_650 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX((StrX *)local_6c0,pXVar3);
      StrX::localForm((StrX *)local_6c0);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4dc,lex_v_ran_v_3 + 0x18);
      StrX::~StrX((StrX *)local_6c0);
      errSeen = true;
    }
    else {
      memcpy(&local_688,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_3.fValue + 0x18);
      memcpy(&local_6b0,pvVar10,0x28);
      actValue_01.fValue.f_long = uStack_680;
      actValue_01._0_8_ = local_688;
      actValue_01.fValue._8_8_ = local_678;
      actValue_01.fValue._16_8_ = uStack_670;
      actValue_01.fValue.f_datetime.f_milisec = (double)local_668;
      expValue_01.fValue.f_long = uStack_6a8;
      expValue_01._0_8_ = local_6b0;
      expValue_01.fValue._8_8_ = local_6a0;
      expValue_01.fValue._16_8_ = uStack_698;
      expValue_01.fValue.f_datetime.f_milisec = (double)local_690;
      bVar2 = compareActualValue(dt_double,actValue_01,expValue_01);
      pXVar5 = local_650;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_650 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_650);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_3._4_4_ = 0;
    StrX::StrX(&local_6e0,lex_v_ran_v_4 + 0x18);
    pXVar3 = StrX::unicodeForm(&local_6e0);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_double,(Status *)((long)&actRetValue_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_6e0);
    local_6d0 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX((StrX *)local_740,pXVar3);
      StrX::localForm((StrX *)local_740);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4dd,lex_v_ran_v_4 + 0x18);
      StrX::~StrX((StrX *)local_740);
      errSeen = true;
    }
    else {
      memcpy(&local_708,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_4.fValue + 0x18);
      memcpy(&local_730,pvVar10,0x28);
      actValue_02.fValue.f_long = uStack_700;
      actValue_02._0_8_ = local_708;
      actValue_02.fValue._8_8_ = local_6f8;
      actValue_02.fValue._16_8_ = uStack_6f0;
      actValue_02.fValue.f_datetime.f_milisec = (double)local_6e8;
      expValue_02.fValue.f_long = uStack_728;
      expValue_02._0_8_ = local_730;
      expValue_02.fValue._8_8_ = local_720;
      expValue_02.fValue._16_8_ = uStack_718;
      expValue_02.fValue.f_datetime.f_milisec = (double)local_710;
      bVar2 = compareActualValue(dt_double,actValue_02,expValue_02);
      pXVar5 = local_6d0;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_6d0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_6d0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_4._4_4_ = 0;
    StrX::StrX(&local_760,(char *)((long)&act_v_ran_v_0.fValue + 0x18));
    pXVar3 = StrX::unicodeForm(&local_760);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_double,(Status *)((long)&actRetValue_4 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_760);
    local_750 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX((StrX *)local_7c0,pXVar3);
      StrX::localForm((StrX *)local_7c0);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4de,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18));
      StrX::~StrX((StrX *)local_7c0);
      errSeen = true;
    }
    else {
      memcpy(&local_788,pXVar5,0x28);
      __src = local_170;
      memcpy(&local_7b0,__src,0x28);
      actValue_03.fValue.f_long = uStack_780;
      actValue_03._0_8_ = local_788;
      actValue_03.fValue._8_8_ = local_778;
      actValue_03.fValue._16_8_ = uStack_770;
      actValue_03.fValue.f_datetime.f_milisec = (double)local_768;
      expValue_03.fValue.f_long = uStack_7a8;
      expValue_03._0_8_ = local_7b0;
      expValue_03.fValue._8_8_ = local_7a0;
      expValue_03.fValue._16_8_ = uStack_798;
      expValue_03.fValue.f_datetime.f_milisec = (double)local_790;
      bVar2 = compareActualValue(dt_double,actValue_03,expValue_03);
      pXVar5 = local_750;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_750 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_750);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,__src);
      }
    }
    actRetValue_5._4_4_ = 0;
    StrX::StrX(&local_7e0,lex_v_ran_iv_2 + 0x18);
    pXVar3 = StrX::unicodeForm(&local_7e0);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_double,(Status *)((long)&actRetValue_5 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_7e0);
    local_7d0 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX((StrX *)local_840,pXVar3);
      StrX::localForm((StrX *)local_840);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4e1,lex_v_ran_iv_2 + 0x18);
      StrX::~StrX((StrX *)local_840);
      errSeen = true;
    }
    else {
      memcpy(&local_808,pXVar5,0x28);
      pvVar10 = (void *)((long)&lex_iv_ran_v_2.fValue + 0x18);
      memcpy(&local_830,pvVar10,0x28);
      actValue_04.fValue.f_long = uStack_800;
      actValue_04._0_8_ = local_808;
      actValue_04.fValue._8_8_ = local_7f8;
      actValue_04.fValue._16_8_ = uStack_7f0;
      actValue_04.fValue.f_datetime.f_milisec = (double)local_7e8;
      expValue_04.fValue.f_long = uStack_828;
      expValue_04._0_8_ = local_830;
      expValue_04.fValue._8_8_ = local_820;
      expValue_04.fValue._16_8_ = uStack_818;
      expValue_04.fValue.f_datetime.f_milisec = (double)local_810;
      bVar2 = compareActualValue(dt_double,actValue_04,expValue_04);
      pXVar5 = local_7d0;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_7d0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_7d0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_6._4_4_ = 0;
    StrX::StrX(&local_860,lex_v_ran_iv_3 + 0x18);
    pXVar3 = StrX::unicodeForm(&local_860);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_double,(Status *)((long)&actRetValue_6 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_860);
    local_850 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX((StrX *)local_8c0,pXVar3);
      StrX::localForm((StrX *)local_8c0);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4e2,lex_v_ran_iv_3 + 0x18);
      StrX::~StrX((StrX *)local_8c0);
      errSeen = true;
    }
    else {
      memcpy(&local_888,pXVar5,0x28);
      pvVar10 = (void *)((long)&lex_iv_ran_v_3.fValue + 0x18);
      memcpy(&local_8b0,pvVar10,0x28);
      actValue_05.fValue.f_long = uStack_880;
      actValue_05._0_8_ = local_888;
      actValue_05.fValue._8_8_ = local_878;
      actValue_05.fValue._16_8_ = uStack_870;
      actValue_05.fValue.f_datetime.f_milisec = (double)local_868;
      expValue_05.fValue.f_long = uStack_8a8;
      expValue_05._0_8_ = local_8b0;
      expValue_05.fValue._8_8_ = local_8a0;
      expValue_05.fValue._16_8_ = uStack_898;
      expValue_05.fValue.f_datetime.f_milisec = (double)local_890;
      bVar2 = compareActualValue(dt_double,actValue_05,expValue_05);
      pXVar5 = local_850;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_850 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_850);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_7._4_4_ = 0;
    StrX::StrX(&local_8e0,lex_v_ran_iv_4 + 0x18);
    pXVar3 = StrX::unicodeForm(&local_8e0);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_double,(Status *)((long)&actRetValue_7 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_8e0);
    local_8d0 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX((StrX *)local_940,pXVar3);
      StrX::localForm((StrX *)local_940);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4e3,lex_v_ran_iv_4 + 0x18);
      StrX::~StrX((StrX *)local_940);
      errSeen = true;
    }
    else {
      memcpy(&local_908,pXVar5,0x28);
      pvVar10 = (void *)((long)&lex_iv_ran_v_4.fValue + 0x18);
      memcpy(&local_930,pvVar10,0x28);
      actValue_06.fValue.f_long = uStack_900;
      actValue_06._0_8_ = local_908;
      actValue_06.fValue._8_8_ = local_8f8;
      actValue_06.fValue._16_8_ = uStack_8f0;
      actValue_06.fValue.f_datetime.f_milisec = (double)local_8e8;
      expValue_06.fValue.f_long = uStack_928;
      expValue_06._0_8_ = local_930;
      expValue_06.fValue._8_8_ = local_920;
      expValue_06.fValue._16_8_ = uStack_918;
      expValue_06.fValue.f_datetime.f_milisec = (double)local_910;
      bVar2 = compareActualValue(dt_double,actValue_06,expValue_06);
      pXVar5 = local_8d0;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_8d0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_8d0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_8._4_4_ = 0;
    StrX::StrX(&local_960,lex_v_ran_iv_2_canrep + 4);
    pXVar3 = StrX::unicodeForm(&local_960);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_double,(Status *)((long)&actRetValue_8 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_960);
    local_950 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX((StrX *)local_9c0,pXVar3);
      StrX::localForm((StrX *)local_9c0);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4e4,lex_v_ran_iv_2_canrep + 4);
      StrX::~StrX((StrX *)local_9c0);
      errSeen = true;
    }
    else {
      memcpy(&local_988,pXVar5,0x28);
      pcVar4 = lex_iv_1 + 8;
      memcpy(&local_9b0,pcVar4,0x28);
      actValue_07.fValue.f_long = uStack_980;
      actValue_07._0_8_ = local_988;
      actValue_07.fValue._8_8_ = local_978;
      actValue_07.fValue._16_8_ = uStack_970;
      actValue_07.fValue.f_datetime.f_milisec = (double)local_968;
      expValue_07.fValue.f_long = uStack_9a8;
      expValue_07._0_8_ = local_9b0;
      expValue_07.fValue._8_8_ = local_9a0;
      expValue_07.fValue._16_8_ = uStack_998;
      expValue_07.fValue.f_datetime.f_milisec = (double)local_990;
      bVar2 = compareActualValue(dt_double,actValue_07,expValue_07);
      pXVar5 = local_950;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_950 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_950);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pcVar4);
      }
    }
    actRetValue_9._4_4_ = st_Init;
    StrX::StrX(&local_9e0,lex_iv_2);
    pXVar3 = StrX::unicodeForm(&local_9e0);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_double,(Status *)((long)&actRetValue_9 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_9e0);
    local_9d0 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_9._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_double);
        StrX::StrX((StrX *)local_a00,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_a00);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_9._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x4e7,lex_iv_2,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_a00);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX(&local_9f0,pXVar3);
      StrX::localForm(&local_9f0);
      pvVar10 = (void *)0x4e7;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4e7,lex_iv_2);
      StrX::~StrX(&local_9f0);
      pXVar5 = local_9d0;
      errSeen = true;
      if (local_9d0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_9d0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_10._4_4_ = st_Init;
    StrX::StrX(&local_a20,data_rawstr_1 + 0x10);
    pXVar3 = StrX::unicodeForm(&local_a20);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_double,(Status *)((long)&actRetValue_10 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_a20);
    local_a10 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_10._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_double);
        StrX::StrX((StrX *)&myStatus_22,pXVar3);
        pcVar4 = StrX::localForm((StrX *)&myStatus_22);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_10._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x4e8,data_rawstr_1 + 0x10,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)&myStatus_22);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX(&local_a30,pXVar3);
      StrX::localForm(&local_a30);
      pvVar10 = (void *)0x4e8;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x4e8,data_rawstr_1 + 0x10);
      StrX::~StrX(&local_a30);
      pXVar5 = local_a10;
      errSeen = true;
      if (local_a10 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_a10);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
  }
  for (actRetCanRep._4_4_ = 0; actRetCanRep._4_4_ < 2; actRetCanRep._4_4_ = actRetCanRep._4_4_ + 1)
  {
    bVar11 = actRetCanRep._4_4_ == 0;
    actRetCanRep._0_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar,data_canrep_1 + 8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_double,(Status *)&actRetCanRep,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar);
    local_a50 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX((StrX *)local_a88,pXVar3);
      StrX::localForm((StrX *)local_a88);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x508,data_canrep_1 + 8);
      StrX::~StrX((StrX *)local_a88);
      errSeen = true;
    }
    else {
      local_a68 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_a68,data_rawstr_2);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_double);
        StrX::StrX(&local_a78,pXVar3);
        pcVar4 = StrX::localForm(&local_a78);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x508,data_canrep_1 + 8,pcVar4,local_a68,data_rawstr_2);
        StrX::~StrX(&local_a78);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_a50);
      xercesc_4_0::XMLString::release(&local_a68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_1._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_1,data_canrep_2 + 8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_1);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_double,(Status *)((long)&actRetCanRep_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_1);
    local_a98 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX((StrX *)local_ad0,pXVar3);
      StrX::localForm((StrX *)local_ad0);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x509,data_canrep_2 + 8);
      StrX::~StrX((StrX *)local_ad0);
      errSeen = true;
    }
    else {
      local_ab0 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_ab0,data_rawstr_3 + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_double);
        StrX::StrX(&local_ac0,pXVar3);
        pcVar4 = StrX::localForm(&local_ac0);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x509,data_canrep_2 + 8,pcVar4,local_ab0,data_rawstr_3 + 8);
        StrX::~StrX(&local_ac0);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_a98);
      xercesc_4_0::XMLString::release(&local_ab0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_2._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_2,data_canrep_3 + 8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_2);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_double,(Status *)((long)&actRetCanRep_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_2);
    local_ae0 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX((StrX *)local_b18,pXVar3);
      StrX::localForm((StrX *)local_b18);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x50a,data_canrep_3 + 8);
      StrX::~StrX((StrX *)local_b18);
      errSeen = true;
    }
    else {
      local_af8 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_af8,data_rawstr_4 + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_double);
        StrX::StrX(&local_b08,pXVar3);
        pcVar4 = StrX::localForm(&local_b08);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x50a,data_canrep_3 + 8,pcVar4,local_af8,data_rawstr_4 + 8);
        StrX::~StrX(&local_b08);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_ae0);
      xercesc_4_0::XMLString::release(&local_af8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_3._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_3,data_canrep_4);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_3);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_double,(Status *)((long)&actRetCanRep_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_3);
    local_b28 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX((StrX *)local_b60,pXVar3);
      StrX::localForm((StrX *)local_b60);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x50b,data_canrep_4);
      StrX::~StrX((StrX *)local_b60);
      errSeen = true;
    }
    else {
      local_b40 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_b40,data_rawstr_5 + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_double);
        StrX::StrX(&local_b50,pXVar3);
        pcVar4 = StrX::localForm(&local_b50);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x50b,data_canrep_4,pcVar4,local_b40,data_rawstr_5 + 8);
        StrX::~StrX(&local_b50);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_b28);
      xercesc_4_0::XMLString::release(&local_b40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_4._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_4,data_canrep_5 + 8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_4);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_double,(Status *)((long)&actRetCanRep_4 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_4);
    local_b70 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX((StrX *)local_ba8,pXVar3);
      StrX::localForm((StrX *)local_ba8);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x50c,data_canrep_5 + 8);
      StrX::~StrX((StrX *)local_ba8);
      errSeen = true;
    }
    else {
      local_b88 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_b88,acStack_358);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_double);
        StrX::StrX(&local_b98,pXVar3);
        pcVar4 = StrX::localForm(&local_b98);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x50c,data_canrep_5 + 8,pcVar4,local_b88,acStack_358);
        StrX::~StrX(&local_b98);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_b70);
      xercesc_4_0::XMLString::release(&local_b88,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_5._4_4_ = st_Init;
    StrX::StrX(&local_bc8,lex_iv_2);
    pXVar3 = StrX::unicodeForm(&local_bc8);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_double,(Status *)((long)&actRetCanRep_5 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_bc8);
    local_bb8 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_5._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_double);
        StrX::StrX((StrX *)local_be8,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_be8);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_5._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x50f,lex_iv_2,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_be8);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX(&local_bd8,pXVar3);
      StrX::localForm(&local_bd8);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x50f,lex_iv_2);
      StrX::~StrX(&local_bd8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_bb8);
      errSeen = true;
    }
    actRetCanRep_6._4_4_ = st_Init;
    StrX::StrX(&local_c08,data_rawstr_1 + 0x10);
    pXVar3 = StrX::unicodeForm(&local_c08);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_double,(Status *)((long)&actRetCanRep_6 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c08);
    local_bf8 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_6._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_double);
        StrX::StrX((StrX *)local_c28,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_c28);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_6._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x510,data_rawstr_1 + 0x10,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_c28);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX(&local_c18,pXVar3);
      StrX::localForm(&local_c18);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x510,data_rawstr_1 + 0x10);
      StrX::~StrX(&local_c18);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_bf8);
      errSeen = true;
    }
    actRetCanRep_7._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_5,lex_v_ran_iv_2 + 0x18);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_5);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_double,(Status *)((long)&actRetCanRep_7 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_5);
    local_c38 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX((StrX *)local_c70,pXVar3);
      StrX::localForm((StrX *)local_c70);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x513,lex_v_ran_iv_2 + 0x18);
      StrX::~StrX((StrX *)local_c70);
      errSeen = true;
    }
    else {
      local_c50 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_c50,lex_v_ran_iv_2_canrep);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_double);
        StrX::StrX(&local_c60,pXVar3);
        pcVar4 = StrX::localForm(&local_c60);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x513,lex_v_ran_iv_2 + 0x18,pcVar4,local_c50,lex_v_ran_iv_2_canrep);
        StrX::~StrX(&local_c60);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_c38);
      xercesc_4_0::XMLString::release(&local_c50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_8._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_6,lex_v_ran_iv_3 + 0x18);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_6);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_double,(Status *)((long)&actRetCanRep_8 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_6);
    local_c80 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX((StrX *)local_cb8,pXVar3);
      StrX::localForm((StrX *)local_cb8);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x514,lex_v_ran_iv_3 + 0x18);
      StrX::~StrX((StrX *)local_cb8);
      errSeen = true;
    }
    else {
      local_c98 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals
                        (local_c98,(char *)((long)&lex_iv_ran_v_1.fValue + 0x1c));
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_double);
        StrX::StrX(&local_ca8,pXVar3);
        pcVar4 = StrX::localForm(&local_ca8);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x514,lex_v_ran_iv_3 + 0x18,pcVar4,local_c98,
               (undefined1 *)((long)&lex_iv_ran_v_1.fValue + 0x1c));
        StrX::~StrX(&local_ca8);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_c80);
      xercesc_4_0::XMLString::release(&local_c98,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_9._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_7,lex_v_ran_iv_4 + 0x18);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_7);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_double,(Status *)((long)&actRetCanRep_9 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_7);
    local_cc8 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX((StrX *)local_d00,pXVar3);
      StrX::localForm((StrX *)local_d00);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x515,lex_v_ran_iv_4 + 0x18);
      StrX::~StrX((StrX *)local_d00);
      errSeen = true;
    }
    else {
      local_ce0 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals
                        (local_ce0,(char *)((long)&lex_iv_ran_v_1.fValue + 0x1a));
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_double);
        StrX::StrX(&local_cf0,pXVar3);
        pcVar4 = StrX::localForm(&local_cf0);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x515,lex_v_ran_iv_4 + 0x18,pcVar4,local_ce0,
               (undefined1 *)((long)&lex_iv_ran_v_1.fValue + 0x1a));
        StrX::~StrX(&local_cf0);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_cc8);
      xercesc_4_0::XMLString::release(&local_ce0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_10._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_8,lex_v_ran_iv_2_canrep + 4);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_8);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_double,(Status *)((long)&actRetCanRep_10 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_8);
    local_d10 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_double);
      StrX::StrX(&local_d48,pXVar3);
      StrX::localForm(&local_d48);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x516,lex_v_ran_iv_2_canrep + 4);
      StrX::~StrX(&local_d48);
      errSeen = true;
    }
    else {
      local_d28 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar11 = xercesc_4_0::XMLString::equals
                         (local_d28,(char *)((long)&lex_iv_ran_v_1.fValue + 0x18));
      if (!bVar11) {
        pXVar3 = getDataTypeString(dt_double);
        StrX::StrX(&local_d38,pXVar3);
        pcVar4 = StrX::localForm(&local_d38);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x516,lex_v_ran_iv_2_canrep + 4,pcVar4,local_d28,
               (undefined1 *)((long)&lex_iv_ran_v_1.fValue + 0x18));
        StrX::~StrX(&local_d38);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_d10);
      xercesc_4_0::XMLString::release(&local_d28,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
  }
  return;
}

Assistant:

void test_dt_double()
{

    const XSValue::DataType dt = XSValue::dt_double;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="   1234.e+10   \n";
    const char lex_v_ran_v_1[]="+1.7976931348623158e+308";
    const char lex_v_ran_v_2[]="-1.7976931348623158e+308";
    const char lex_v_ran_v_3[]="+2.2250738585072014e-308";
    const char lex_v_ran_v_4[]="-2.2250738585072014e-308";

    XSValue::XSValue_Data act_v_ran_v_0; act_v_ran_v_0.fValue.f_double = (double)1234.e+10;
    XSValue::XSValue_Data act_v_ran_v_1; act_v_ran_v_1.fValue.f_double = (double)+1.7976931348623158e+308;
    XSValue::XSValue_Data act_v_ran_v_2; act_v_ran_v_2.fValue.f_double = (double)-1.7976931348623158e+308;
    XSValue::XSValue_Data act_v_ran_v_3; act_v_ran_v_3.fValue.f_double = (double)+2.2250738585072014e-308;
    XSValue::XSValue_Data act_v_ran_v_4; act_v_ran_v_4.fValue.f_double = (double)-2.2250738585072014e-308;

    const char lex_v_ran_iv_1[]="+1.7976931348623158e+309";
    const char lex_v_ran_iv_2[]="-1.7976931348623158e+309";
    // on linux, hp, aix, the representable range is around e-324
    // or e-325, using e-329 to gain consistent result on all
    // platforms
    const char lex_v_ran_iv_3[]="+2.2250738585072014e-329";
    const char lex_v_ran_iv_4[]="-2.2250738585072014e-329";

    const char lex_v_ran_iv_1_canrep[]="INF";  // " 1.7976931348623158E309";
    const char lex_v_ran_iv_2_canrep[]="-INF"; // "-1.7976931348623158E309";
    const char lex_v_ran_iv_3_canrep[]="0";    // "2.2250738585072014E-329";
    const char lex_v_ran_iv_4_canrep[]="0";    // "-2.2250738585072014E-329";

    XSValue::XSValue_Data lex_iv_ran_v_1; lex_iv_ran_v_1.fValue.f_double = (double)0.0;
    lex_iv_ran_v_1.fValue.f_doubleType.f_doubleEnum = XSValue::DoubleFloatType_PosINF;
    XSValue::XSValue_Data lex_iv_ran_v_2; lex_iv_ran_v_2.fValue.f_double = (double)0.0;
    lex_iv_ran_v_2.fValue.f_doubleType.f_doubleEnum = XSValue::DoubleFloatType_NegINF;
    XSValue::XSValue_Data lex_iv_ran_v_3; lex_iv_ran_v_3.fValue.f_double = (double)0.0;
    lex_iv_ran_v_3.fValue.f_doubleType.f_doubleEnum = XSValue::DoubleFloatType_Zero;
    XSValue::XSValue_Data lex_iv_ran_v_4; lex_iv_ran_v_4.fValue.f_double = (double)0.0;
    lex_iv_ran_v_4.fValue.f_doubleType.f_doubleEnum = XSValue::DoubleFloatType_Zero;

    const char lex_iv_1[]="12x.e+10";
    const char lex_iv_2[]="12.e+1x";

/***
 * 3.2.5.2 Canonical representation
 *
 * The canonical representation for float is defined by prohibiting certain options from the Lexical
 * representation (3.2.5.1).
 * Specifically,
 * 1. the exponent must be indicated by "E".
 * 2. Leading zeroes and the preceding optional "+" sign are prohibited in the exponent.
 * 3. For the mantissa, the preceding optional "+" sign is prohibited and the decimal point is required.
 *    Leading and trailing zeroes are prohibited subject to the following:
 *    number representations must be normalized such that there is a single digit to the left of the decimal point
 *    and at least a single digit to the right of the decimal point.
 *
 ***/

    const char data_rawstr_1[]="    -123.45    \n";
    const char data_canrep_1[]="-1.2345E2";
    const char data_rawstr_2[]="+123.45";
    const char data_canrep_2[]="1.2345E2";
    const char data_rawstr_3[]="+123.45e+0012";
    const char data_canrep_3[]="1.2345E14";
    const char data_rawstr_4[]="+100.000e2";
    const char data_canrep_4[]="1.0E4";
    const char data_rawstr_5[]="00100.23e2";
    const char data_canrep_5[]="1.0023E4";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, range valid
    VALIDATE_TEST(lex_v_ran_v_0 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_3 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_4 , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, range invalid however XML4C converts to INF / ZERO
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_iv_3 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_iv_4 , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        // lexical valid, range valid
        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_v_3,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_3);
        ACTVALUE_TEST(lex_v_ran_v_4,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_4);

        // lexical valid, range invalid
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_3, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_3);
        ACTVALUE_TEST(lex_v_ran_iv_4, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_4);

        // lexical invalid
        ACTVALUE_TEST(lex_iv_1      , dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2      , dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                            XMLCh          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        // lexical valid, range valid
        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    DONT_CARE);
        CANREP_TEST(data_rawstr_3,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_3,    DONT_CARE);
        CANREP_TEST(data_rawstr_4,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_4,    DONT_CARE);
        CANREP_TEST(data_rawstr_5,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_5,    DONT_CARE);

        // lexical invalid
        CANREP_TEST(lex_iv_1,         dt, toValidate, EXP_RET_CANREP_FALSE,  null_string,     XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2,         dt, toValidate, EXP_RET_CANREP_FALSE,  null_string,     XSValue::st_FOCA0002);

        // lexical valid, range invalid (XML4C doesn't treat as invalid)
        CANREP_TEST(lex_v_ran_iv_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep,    DONT_CARE);
        CANREP_TEST(lex_v_ran_iv_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep,    DONT_CARE);
        CANREP_TEST(lex_v_ran_iv_3,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_3_canrep,    DONT_CARE);
        CANREP_TEST(lex_v_ran_iv_4,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_4_canrep,    DONT_CARE);
    }
}